

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC8uv_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  int iVar1;
  longlong *in_RDX;
  longlong *in_RSI;
  uint8_t *in_RDI;
  int DC;
  __m128i combined;
  __m128i left_values;
  __m128i top_values;
  longlong local_b8;
  longlong lStack_b0;
  longlong local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  undefined8 uStack_90;
  uint8_t *local_70;
  longlong local_68;
  undefined8 uStack_60;
  longlong local_48;
  undefined8 uStack_40;
  longlong local_28;
  undefined8 uStack_20;
  longlong local_18;
  undefined8 uStack_10;
  
  local_b8 = *in_RDX;
  uStack_40 = 0;
  uStack_90 = 0;
  lStack_b0 = *in_RSI;
  uStack_60 = 0;
  uStack_a0 = 0;
  uStack_10 = 0;
  uStack_20 = 0;
  local_a8 = lStack_b0;
  local_98 = local_b8;
  local_70 = in_RDI;
  local_68 = lStack_b0;
  local_48 = local_b8;
  local_28 = lStack_b0;
  local_18 = local_b8;
  iVar1 = VP8HorizontalAdd8b((__m128i *)&local_b8);
  Put8x8uv_SSE2((uint8_t)(iVar1 + 8 >> 4),local_70);
  return;
}

Assistant:

static void DC8uv_SSE2(uint8_t* dst) {     // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  int left = 0;
  int j;
  for (j = 0; j < 8; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 8;
    Put8x8uv_SSE2(DC >> 4, dst);
  }
}